

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O2

VectorXi __thiscall ear::argSort(ear *this,VectorXd *v)

{
  ulong uVar1;
  pointer piVar2;
  int iVar3;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar4;
  Index extraout_RDX_01;
  Index extraout_RDX_02;
  pointer piVar5;
  long lVar6;
  VectorXi VVar7;
  pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> ret;
  pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_88;
  RandomAccessLinSpacedReturnType local_78;
  pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_58;
  pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_48;
  pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_38;
  
  local_88.m_ptr = (pointer)((ulong)local_88.m_ptr & 0xffffffff00000000);
  iVar3 = (int)(v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_58.m_ptr = (pointer)CONCAT44(local_58.m_ptr._4_4_,iVar3);
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::LinSpaced
            (&local_78,(long)iVar3,(Scalar *)&local_88,(Scalar *)&local_58);
  Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)this,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
              *)&local_78);
  uVar1 = *(ulong *)(this + 8);
  IVar4 = extraout_RDX;
  if (uVar1 != 0) {
    piVar2 = *(pointer *)this;
    lVar6 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    local_48.m_ptr = piVar2 + uVar1;
    local_38.m_ptr = piVar2;
    std::
    __introsort_loop<Eigen::internal::pointer_based_stl_iterator<Eigen::Matrix<int,_1,1,0,_1,1>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ear::argSort(Eigen::Matrix<double,_1,1,0,_1,1>const&)::__0>>
              (&local_38,&local_48,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:34:15)>
                )v);
    if ((long)uVar1 < 0x11) {
      local_88.m_ptr = piVar2 + uVar1;
      local_78.m_rows.m_value = (long)piVar2;
      std::
      __insertion_sort<Eigen::internal::pointer_based_stl_iterator<Eigen::Matrix<int,_1,1,0,_1,1>>,__gnu_cxx::__ops::_Iter_comp_iter<ear::argSort(Eigen::Matrix<double,_1,1,0,_1,1>const&)::__0>>
                ((pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_78,
                 &local_88,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:34:15)>
                  )v);
      IVar4 = extraout_RDX_02;
    }
    else {
      piVar5 = piVar2 + 0x10;
      local_88.m_ptr = piVar2;
      local_58.m_ptr = piVar5;
      std::
      __insertion_sort<Eigen::internal::pointer_based_stl_iterator<Eigen::Matrix<int,_1,1,0,_1,1>>,__gnu_cxx::__ops::_Iter_comp_iter<ear::argSort(Eigen::Matrix<double,_1,1,0,_1,1>const&)::__0>>
                (&local_88,&local_58,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:34:15)>
                  )v);
      IVar4 = extraout_RDX_00;
      for (lVar6 = uVar1 * 4 + -0x40; lVar6 != 0; lVar6 = lVar6 + -4) {
        local_78.m_rows.m_value = (long)piVar5;
        std::
        __unguarded_linear_insert<Eigen::internal::pointer_based_stl_iterator<Eigen::Matrix<int,_1,1,0,_1,1>>,__gnu_cxx::__ops::_Val_comp_iter<ear::argSort(Eigen::Matrix<double,_1,1,0,_1,1>const&)::__0>>
                  ((pointer_based_stl_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&local_78,
                   (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_src_common_geom_cpp:34:15)>
                    )v);
        piVar5 = piVar5 + 1;
        IVar4 = extraout_RDX_01;
      }
    }
  }
  VVar7.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar4;
  VVar7.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)this;
  return (VectorXi)VVar7.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXi argSort(const Eigen::VectorXd& v) {
    Eigen::VectorXi indices = Eigen::VectorXi::LinSpaced(
        static_cast<int>(v.size()), 0, static_cast<int>(v.size()));
    std::sort(indices.begin(), indices.end(),
              [&v](size_t i1, size_t i2) { return v[i1] < v[i2]; });
    return indices;
  }